

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O0

double NEST::NESTcalc::GetDriftVelocity_Liquid
                 (double Kelvin,double eField,double Density,double Bar,short StdDev)

{
  double b;
  bool bVar1;
  int iVar2;
  runtime_error *this;
  ostream *poVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double local_388;
  double Temperatures [11];
  double local_328;
  double polyExp [11] [7];
  double local_b8;
  double Temperature [8];
  double offset;
  double Tf;
  double Ti;
  double slope;
  double vf;
  double vi;
  int j;
  int i;
  double speed;
  short StdDev_local;
  double Bar_local;
  double Density_local;
  double eField_local;
  double Kelvin_local;
  
  _j = 0.0;
  bVar1 = ValidityTests::nearlyEqual(54.0,18.0,1e-09);
  eField_local = Kelvin;
  if (bVar1) {
    memcpy(&local_b8,&DAT_00124a00,0x40);
    if ((Kelvin < 84.0) || (140.0 < Kelvin)) {
      std::operator<<((ostream *)&std::cerr,
                      "\nWARNING: TEMPERATURE OUT OF RANGE (84-140 K) for vD\n");
      std::operator<<((ostream *)&std::cerr,
                      "Using value at closest temp for a drift speed estimate\n");
      iVar2 = clamp((int)Kelvin,0x54,0x8c);
      eField_local = (double)iVar2;
    }
    if ((eField_local < local_b8) || (Temperature[0] <= eField_local)) {
      if ((eField_local < Temperature[0]) || (Temperature[1] <= eField_local)) {
        if ((eField_local < Temperature[1]) || (Temperature[2] <= eField_local)) {
          if ((eField_local < Temperature[2]) || (Temperature[3] <= eField_local)) {
            if ((eField_local < Temperature[3]) || (Temperature[4] <= eField_local)) {
              if ((eField_local < Temperature[4]) || (Temperature[5] <= eField_local)) {
                if ((Temperature[5] <= eField_local) && (eField_local <= Temperature[6])) {
                  dVar4 = log(eField / 1000.0);
                  _j = exp(dVar4 * 0.33645519 + (0.24207633 - 0.03558428 / (eField / 1000.0)));
                }
              }
              else {
                dVar4 = log(eField / 1000.0);
                _j = exp(dVar4 * 0.3290246 + (0.502022794 - 0.06644517 / (eField / 1000.0)));
              }
            }
            else {
              dVar4 = log(eField / 1000.0);
              _j = exp(dVar4 * 0.317972 + (0.76551511 - 0.0731659 / (eField / 1000.0)));
            }
          }
          else {
            dVar4 = log(eField / 1000.0);
            _j = exp(dVar4 * 0.3295202 + (0.6911897 - 0.092997 / (eField / 1000.0)));
          }
        }
        else {
          dVar4 = log(eField / 1000.0);
          _j = exp(dVar4 * 0.320876 + (0.7795972 - 0.0990952 / (eField / 1000.0)));
        }
      }
      else {
        dVar4 = log(eField / 1000.0);
        _j = exp(dVar4 * 0.331798 + (0.80302379 - 0.06694564 / (eField / 1000.0)));
      }
    }
    else {
      dVar4 = log(eField / 1000.0);
      _j = exp(dVar4 * 0.315338 + (0.937729 - 0.0734108 / (eField / 1000.0)));
    }
    if (_j < 0.0) {
      _j = 0.0;
    }
    Kelvin_local = _j;
  }
  else if (StdDev < 1) {
    if (StdDev < 0) {
      memcpy(&local_328,&DAT_00124a40,0x268);
      memcpy(&local_388,&DAT_00124cb0,0x58);
      if ((Kelvin < 100.0) || (230.0 < Kelvin)) {
        std::operator<<((ostream *)&std::cerr,
                        "\nWARNING: TEMPERATURE OUT OF RANGE (100-230 K) for vD\n");
        if (Kelvin < 100.0) {
          eField_local = 100.0;
        }
        if (230.0 < eField_local) {
          eField_local = 230.0;
        }
        std::operator<<((ostream *)&std::cerr,
                        "Using value at closest temp for a drift speed estimate\n");
      }
      if ((eField_local < local_388) || (Temperatures[0] <= eField_local)) {
        if ((eField_local < Temperatures[0]) || (Temperatures[1] <= eField_local)) {
          if ((eField_local < Temperatures[1]) || (Temperatures[2] <= eField_local)) {
            if ((eField_local < Temperatures[2]) || (Temperatures[3] <= eField_local)) {
              if ((eField_local < Temperatures[3]) || (Temperatures[4] <= eField_local)) {
                if ((eField_local < Temperatures[4]) || (Temperatures[5] <= eField_local)) {
                  if ((eField_local < Temperatures[5]) || (Temperatures[6] <= eField_local)) {
                    if ((eField_local < Temperatures[6]) || (Temperatures[7] <= eField_local)) {
                      if ((eField_local < Temperatures[7]) || (Temperatures[8] <= eField_local)) {
                        if ((eField_local < Temperatures[8]) || (Temperatures[9] < eField_local)) {
                          this = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error
                                    (this,"ERROR: TEMPERATURE OUT OF RANGE (100-230 K)");
                          __cxa_throw(this,&std::runtime_error::typeinfo,
                                      std::runtime_error::~runtime_error);
                        }
                        vi._4_4_ = 9;
                      }
                      else {
                        vi._4_4_ = 8;
                      }
                    }
                    else {
                      vi._4_4_ = 7;
                    }
                  }
                  else {
                    vi._4_4_ = 6;
                  }
                }
                else {
                  vi._4_4_ = 5;
                }
              }
              else {
                vi._4_4_ = 4;
              }
            }
            else {
              vi._4_4_ = 3;
            }
          }
          else {
            vi._4_4_ = 2;
          }
        }
        else {
          vi._4_4_ = 1;
        }
      }
      else {
        vi._4_4_ = 0;
      }
      iVar2 = vi._4_4_ + 1;
      dVar4 = Temperatures[(long)vi._4_4_ + -1];
      b = Temperatures[(long)iVar2 + -1];
      dVar8 = polyExp[(long)vi._4_4_ + -1][6];
      dVar5 = exp(-eField / polyExp[vi._4_4_][0]);
      dVar9 = polyExp[vi._4_4_][1];
      dVar6 = exp(-eField / polyExp[vi._4_4_][2]);
      dVar10 = polyExp[vi._4_4_][3];
      dVar7 = exp(-eField / polyExp[vi._4_4_][4]);
      _j = dVar10 * dVar7 + dVar8 * dVar5 + dVar9 * dVar6 + polyExp[vi._4_4_][5];
      dVar8 = polyExp[(long)iVar2 + -1][6];
      dVar5 = exp(-eField / polyExp[iVar2][0]);
      dVar9 = polyExp[iVar2][1];
      dVar6 = exp(-eField / polyExp[iVar2][2]);
      dVar10 = polyExp[iVar2][3];
      dVar7 = exp(-eField / polyExp[iVar2][4]);
      dVar8 = dVar10 * dVar7 + dVar8 * dVar5 + dVar9 * dVar6 + polyExp[iVar2][5];
      bVar1 = ValidityTests::nearlyEqual(eField_local,dVar4,1e-09);
      Kelvin_local = _j;
      if ((!bVar1) &&
         (bVar1 = ValidityTests::nearlyEqual(eField_local,b,1e-09), Kelvin_local = dVar8, !bVar1)) {
        if (_j <= dVar8) {
          _j = ((dVar8 - _j) / (b - dVar4)) * (eField_local - dVar4) + _j;
        }
        else {
          dVar9 = sqrt(((b * (dVar8 - _j) + -(dVar4 * (dVar8 - _j))) - 4.0) * (dVar8 - _j));
          dVar10 = sqrt(b - dVar4);
          dVar5 = sqrt(b - dVar4);
          Temperature[7] = (dVar10 * (dVar8 + _j) + dVar9) / (dVar5 * 2.0);
          dVar9 = sqrt(b - dVar4);
          dVar10 = sqrt(((b * (dVar8 - _j) + -(dVar4 * (dVar8 - _j))) - 4.0) * (dVar8 - _j));
          _j = 1.0 / (eField_local -
                     -(dVar9 * dVar10 + -((b + dVar4) * (dVar8 - _j))) / ((dVar8 - _j) * 2.0)) +
               Temperature[7];
        }
        if (_j <= 0.0) {
          poVar3 = std::operator<<((ostream *)&std::cerr,
                                   "\nWARNING: DRIFT SPEED NON-POSITIVE. Setting to 0.1 mm/us\t");
          poVar3 = std::operator<<(poVar3,
                                   "Line Number ~1950 of NEST.cpp, in function NESTcalc::GetDriftVelocity_Liquid\t"
                                  );
          std::operator<<(poVar3,
                          "Stop bothering Matthew about this, and fix underlying cause in your code!\n"
                         );
          if ((100.0 <= eField) || (eField < 1.0)) {
            if (eField <= 10000.0) {
              std::operator<<((ostream *)&std::cerr,
                              "Something unknown went wrong: are you in a noble element?? ");
            }
            else {
              std::operator<<((ostream *)&std::cerr,"FIELD MAYBE TOO HIGH. ");
            }
          }
          else {
            std::operator<<((ostream *)&std::cerr,"FIELD MAY BE TOO LOW. ");
          }
          poVar3 = std::operator<<((ostream *)&std::cerr,"EF = ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,eField);
          poVar3 = std::operator<<(poVar3," V/cm. T = ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,eField_local);
          poVar3 = std::operator<<(poVar3," Kelvin");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          _j = 0.1;
        }
        Kelvin_local = _j;
      }
    }
    else {
      dVar4 = pow(eField / 31.683,1.3237);
      Kelvin_local = 1.7681 - 1.7681 / (dVar4 + 1.0);
    }
  }
  else {
    dVar4 = pow(eField / 30.0,1.3);
    Kelvin_local = 1.83 - 1.83 / (dVar4 + 1.0);
  }
  return Kelvin_local;
}

Assistant:

double NESTcalc::GetDriftVelocity_Liquid(double Kelvin, double eField, double Density,
                                         double Bar, short int StdDev) {
  // for liquid and solid only. Density and purity dependencies to be
  // added in the future.

  double speed =
      0.0;  // returns drift speed in mm/usec. based on Fig. 14 arXiv:1712.08607
  int i, j;
  double vi, vf, slope, Ti, Tf, offset;

  if (ValidityTests::nearlyEqual(ATOM_NUM, 18.)) {
    // replace eventually with Kate's work, once T's splined as done for LXe and
    // SXe
    /*x_nest is field in kV/cm:
    Liquid:
    y_nest_85 = 2.553969*(0.929235**(1/x_nest))*x_nest**0.315673 // temperatures
    in Kelvin y_nest_87 = 2.189388*(0.961701**(1/x_nest))*x_nest**0.339414
    y_nest_89 = 2.201489*(0.931080**(1/x_nest))*x_nest**0.320762
    y_nest_94 = 1.984534*(0.936081**(1/x_nest))*x_nest**0.332491
    y_nest_100 = 2.150101*(0.929447**(1/x_nest))*x_nest**0.317973
    y_nest_120 = 1.652059*(0.935714**(1/x_nest))*x_nest**0.329025
    y_nest_130 = 1.273891*(0.965041**(1/x_nest))*x_nest**0.336455
    Solid:
    y_nest_80 = 7.063288*(0.929753**(1/x_nest))*x_nest**0.314640
    y_nest_82 = 5.093097*(0.920459**(1/x_nest))*x_nest**0.458724*/
    double Temperature[8] = {85., 86., 88., 92., 96., 110., 125., 140.};

    if (Kelvin < 84. || Kelvin > 140.) {
      cerr << "\nWARNING: TEMPERATURE OUT OF RANGE (84-140 K) for vD\n";
      cerr << "Using value at closest temp for a drift speed estimate\n";
      Kelvin = (double)NESTcalc::clamp(int(Kelvin), 84, 140);
    }
	//if (Kelvin==89) speed =  2.201489*pow(0.931080,1/(eField/1000))*pow((eField/1000), 0.320762);
   if (Kelvin >= Temperature[0] && Kelvin < Temperature[1])
      speed = exp(0.937729 - 0.0734108 / (eField / 1000) +
                  0.315338 * log(eField / 1000));
    else if (Kelvin >= Temperature[1] && Kelvin < Temperature[2])
      speed = exp(0.80302379 - 0.06694564 / (eField / 1000) +
                  0.331798 * log(eField / 1000));
    else if (Kelvin >= Temperature[2] && Kelvin < Temperature[3])
      speed = exp(0.7795972 - 0.0990952 / (eField / 1000) +
                  0.320876 * log(eField / 1000));
    else if (Kelvin >= Temperature[3] && Kelvin < Temperature[4])
      speed = exp(0.6911897 - 0.092997 / (eField / 1000) +
                  0.3295202 * log(eField / 1000));
    else if (Kelvin >= Temperature[4] && Kelvin < Temperature[5])
      speed = exp(0.76551511 - 0.0731659 / (eField / 1000) +
                  0.317972 * log(eField / 1000));
    else if (Kelvin >= Temperature[5] && Kelvin < Temperature[6])
      speed = exp(0.502022794 - 0.06644517 / (eField / 1000) +
                  0.3290246 * log(eField / 1000));
    else if (Kelvin >= Temperature[6] && Kelvin <= Temperature[7])
      speed = exp(0.24207633 - 0.03558428 / (eField / 1000) +
                  0.33645519 * log(eField / 1000));

    if (speed < 0.) speed = 0.;
    return speed;
  }

  if (StdDev >= 1)
    return 1.83 - 1.83 / (1. + pow(eField / 30., 1.3));  // eF<260V/cm
  if (StdDev >= 0) return 1.7681 - 1.7681 / (1. + pow(eField / 31.683, 1.3237));

  double polyExp[11][7] = {
      {-3.1046, 27.037, -2.1668, 193.27, -4.8024, 646.04, 9.2471},  // 100K
      {-2.7394, 22.760, -1.7775, 222.72, -5.0836, 724.98, 8.7189},  // 120
      {-2.3646, 164.91, -1.6984, 21.473, -4.4752, 1202.2, 7.9744},  // 140
      {-1.8097, 235.65, -1.7621, 36.855, -3.5925, 1356.2, 6.7865},  // 155
      {-1.5000, 37.021, -1.1430, 6.4590, -4.0337, 855.43,
       5.4238},  // 157, merging Miller with Yoo
      {-1.4939, 47.879, 0.12608, 8.9095, -1.3480, 1310.9,
       2.7598},  // 163, merging Miller with Yoo
      {-1.5389, 26.602, -.44589, 196.08, -1.1516, 1810.8, 2.8912},  // 165
      {-1.5000, 28.510, -.21948, 183.49, -1.4320, 1652.9, 2.884},   // 167
      {-1.1781, 49.072, -1.3008, 3438.4, -.14817, 312.12, 2.8049},  // 184
      {1.2466, 85.975, -.88005, 918.57, -3.0085, 27.568, 2.3823},   // 200
      {334.60, 37.556, 0.92211, 345.27, -338.00, 37.346, 1.9834}};  // 230

  double Temperatures[11] = {100., 120., 140., 155., 157., 163.,
                             165., 167., 184., 200., 230.};

  if (Kelvin < 100. || Kelvin > 230.) {
    cerr << "\nWARNING: TEMPERATURE OUT OF RANGE (100-230 K) for vD\n";
    if (Kelvin < 100.) Kelvin = 100.;
    if (Kelvin > 230.) Kelvin = 230.;
    cerr << "Using value at closest temp for a drift speed estimate\n";
  }

  if (Kelvin >= Temperatures[0] && Kelvin < Temperatures[1])
    i = 0;
  else if (Kelvin >= Temperatures[1] && Kelvin < Temperatures[2])
    i = 1;
  else if (Kelvin >= Temperatures[2] && Kelvin < Temperatures[3])
    i = 2;
  else if (Kelvin >= Temperatures[3] && Kelvin < Temperatures[4])
    i = 3;
  else if (Kelvin >= Temperatures[4] && Kelvin < Temperatures[5])
    i = 4;
  else if (Kelvin >= Temperatures[5] && Kelvin < Temperatures[6])
    i = 5;
  else if (Kelvin >= Temperatures[6] && Kelvin < Temperatures[7])
    i = 6;
  else if (Kelvin >= Temperatures[7] && Kelvin < Temperatures[8])
    i = 7;
  else if (Kelvin >= Temperatures[8] && Kelvin < Temperatures[9])
    i = 8;
  else if (Kelvin >= Temperatures[9] && Kelvin <= Temperatures[10])
    i = 9;
  else {
    throw std::runtime_error("ERROR: TEMPERATURE OUT OF RANGE (100-230 K)");
  }

  j = i + 1;
  Ti = Temperatures[i];
  Tf = Temperatures[j];
  // functional form from http://zunzun.com
  vi = polyExp[i][0] * exp(-eField / polyExp[i][1]) +
       polyExp[i][2] * exp(-eField / polyExp[i][3]) +
       polyExp[i][4] * exp(-eField / polyExp[i][5]) + polyExp[i][6];
  vf = polyExp[j][0] * exp(-eField / polyExp[j][1]) +
       polyExp[j][2] * exp(-eField / polyExp[j][3]) +
       polyExp[j][4] * exp(-eField / polyExp[j][5]) + polyExp[j][6];
  if (ValidityTests::nearlyEqual(Kelvin, Ti)) return vi;
  if (ValidityTests::nearlyEqual(Kelvin, Tf)) return vf;
  if (vf < vi) {
    offset = (sqrt((Tf * (vf - vi) - Ti * (vf - vi) - 4.) * (vf - vi)) +
              sqrt(Tf - Ti) * (vf + vi)) /
             (2. * sqrt(Tf - Ti));
    slope = -(sqrt(Tf - Ti) *
                  sqrt((Tf * (vf - vi) - Ti * (vf - vi) - 4.) * (vf - vi)) -
              (Tf + Ti) * (vf - vi)) /
            (2. * (vf - vi));
    speed = 1. / (Kelvin - slope) + offset;
  } else {
    slope = (vf - vi) / (Tf - Ti);
    speed = slope * (Kelvin - Ti) + vi;
  }

  if (speed <= 0.) {
    cerr << "\nWARNING: DRIFT SPEED NON-POSITIVE. Setting to 0.1 mm/us\t"
         << "Line Number ~1950 of NEST.cpp, in function "
            "NESTcalc::GetDriftVelocity_Liquid\t"
         << "Stop bothering Matthew about this, and fix underlying cause in "
            "your code!\n";
    if (eField < 1e2 && eField >= FIELD_MIN) {
      cerr << "FIELD MAY BE TOO LOW. ";
    } else if (eField > 1e4) {
      cerr << "FIELD MAYBE TOO HIGH. ";
    } else {
      cerr << "Something unknown went wrong: are you in a noble element?? ";
    }
    cerr << "EF = " << eField << " V/cm. T = " << Kelvin << " Kelvin" << endl;
    speed = 0.1;
  }
  return speed;  // mm per microsecond
}